

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_count_overlappable_neighbors(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  int iVar1;
  MB_MODE_INFO **ppMVar2;
  MB_MODE_INFO *pMVar3;
  MB_MODE_INFO *pMVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  
  ppMVar2 = xd->mi;
  pMVar3 = *ppMVar2;
  pMVar3->overlappable_neighbors = '\0';
  bVar5 = block_size_high[pMVar3->bsize];
  if (block_size_wide[pMVar3->bsize] < block_size_high[pMVar3->bsize]) {
    bVar5 = block_size_wide[pMVar3->bsize];
  }
  if (7 < bVar5) {
    if (xd->up_available == true) {
      iVar14 = xd->mi_col;
      uVar11 = (ulong)iVar14;
      iVar6 = (uint)xd->width + iVar14;
      iVar1 = (cm->mi_params).mi_cols;
      if (iVar1 <= iVar6) {
        iVar6 = iVar1;
      }
      if (iVar14 < iVar6) {
        lVar13 = (long)xd->mi_stride;
        iVar14 = 0;
        uVar12 = uVar11;
        do {
          uVar9 = (uint)uVar12;
          bVar5 = 0x10;
          if ((0x1f07ffUL >> ((ulong)ppMVar2[((int)uVar9 - lVar13) - uVar11]->bsize & 0x3f) & 1) !=
              0) {
            bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [ppMVar2[((int)uVar9 - lVar13) - uVar11]->bsize];
          }
          lVar7 = ((int)uVar9 - lVar13) - uVar11;
          uVar10 = uVar9 & 0xfffffffe;
          uVar8 = (uint)bVar5;
          if (bVar5 == 1) {
            uVar8 = 2;
            uVar9 = uVar10;
            lVar7 = (((long)(int)uVar10 + 1) - lVar13) - uVar11;
          }
          if (((ppMVar2[lVar7]->field_0xa7 & 0x80) != 0) || ('\0' < ppMVar2[lVar7]->ref_frame[0])) {
            iVar14 = iVar14 + 1;
            pMVar3->overlappable_neighbors = pMVar3->overlappable_neighbors + '\x01';
          }
          uVar12 = (ulong)(uVar9 + uVar8);
        } while (((int)(uVar9 + uVar8) < iVar6) && (iVar14 != 0x7fffffff));
      }
    }
    if ((pMVar3->overlappable_neighbors == '\0') && (xd->left_available == true)) {
      iVar14 = xd->mi_row;
      uVar11 = (ulong)iVar14;
      iVar6 = (uint)xd->height + iVar14;
      iVar1 = (cm->mi_params).mi_rows;
      if (iVar1 <= iVar6) {
        iVar6 = iVar1;
      }
      if (iVar14 < iVar6) {
        ppMVar2 = xd->mi;
        lVar13 = (long)xd->mi_stride * uVar11;
        iVar14 = 0;
        do {
          uVar9 = (uint)uVar11;
          lVar7 = (long)(int)(xd->mi_stride * uVar9);
          uVar11 = (ulong)ppMVar2[(lVar7 + -1) - lVar13]->bsize;
          bVar5 = 0x10;
          if ((0x2f0bffUL >> (uVar11 & 0x3f) & 1) != 0) {
            bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [uVar11];
          }
          if (bVar5 == 1) {
            bVar5 = 2;
            lVar7 = (long)(int)(xd->mi_stride * (uVar9 | 1));
            uVar9 = uVar9 & 0xfffffffe;
          }
          pMVar4 = ppMVar2[(lVar7 + -1) - lVar13];
          if (((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) {
            iVar14 = iVar14 + 1;
            pMVar3->overlappable_neighbors = pMVar3->overlappable_neighbors + '\x01';
          }
        } while (((int)(uVar9 + bVar5) < iVar6) &&
                (uVar11 = (ulong)(uVar9 + bVar5), iVar14 != 0x7fffffff));
      }
    }
  }
  return;
}

Assistant:

void av1_count_overlappable_neighbors(const AV1_COMMON *cm, MACROBLOCKD *xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];

  mbmi->overlappable_neighbors = 0;

  if (!is_motion_variation_allowed_bsize(mbmi->bsize)) return;

  foreach_overlappable_nb_above(cm, xd, INT_MAX, increment_int_ptr,
                                &mbmi->overlappable_neighbors);
  if (mbmi->overlappable_neighbors) return;
  foreach_overlappable_nb_left(cm, xd, INT_MAX, increment_int_ptr,
                               &mbmi->overlappable_neighbors);
}